

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void NotifyCallback(AmsAddr *pAddr,AdsNotificationHeader *pNotification,uint32_t hUser)

{
  _Setfill<char> _Var1;
  int iVar2;
  _Setw _Var3;
  ostream *poVar4;
  void *pvVar5;
  uint8_t *pData;
  uint32_t hUser_local;
  AdsNotificationHeader *pNotification_local;
  AmsAddr *pAddr_local;
  
  if (NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)::notificationOutput
      == '\0') {
    iVar2 = __cxa_guard_acquire(&NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)
                                 ::notificationOutput);
    if (iVar2 != 0) {
      std::ostream::ostream
                (NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)::
                 notificationOutput,(streambuf *)0x0);
      __cxa_atexit(std::ostream::~ostream,
                   NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)::
                   notificationOutput,&__dso_handle);
      __cxa_guard_release(&NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)
                           ::notificationOutput);
    }
  }
  g_NumNotifications = g_NumNotifications + 1;
  _Var1 = std::setfill<char>('0');
  poVar4 = std::operator<<(NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)
                           ::notificationOutput,_Var1._M_c);
  poVar4 = std::operator<<(poVar4,"NetId 0x");
  poVar4 = (ostream *)operator<<(poVar4,&pAddr->netId);
  poVar4 = std::operator<<(poVar4,"hUser 0x");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
  _Var3 = std::setw(4);
  poVar4 = std::operator<<(poVar4,_Var3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,hUser);
  poVar4 = std::operator<<(poVar4," sample time: ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,std::dec);
  poVar4 = (ostream *)std::ostream::operator<<(pvVar5,pNotification->nTimeStamp);
  poVar4 = std::operator<<(poVar4," sample size: ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,std::dec);
  poVar4 = (ostream *)std::ostream::operator<<(pvVar5,pNotification->cbSampleSize);
  poVar4 = std::operator<<(poVar4," value: 0x");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
  poVar4 = (ostream *)std::ostream::operator<<(pvVar5,(uint)(byte)pNotification[1].nTimeStamp);
  std::operator<<(poVar4,'\n');
  return;
}

Assistant:

static void NotifyCallback(const AmsAddr* pAddr, const AdsNotificationHeader* pNotification, uint32_t hUser)
{
#if 0
    static std::ostream& notificationOutput = std::cout;
#else
    static std::ostream notificationOutput(0);
#endif
    ++g_NumNotifications;
    auto pData = reinterpret_cast<const uint8_t*>(pNotification + 1);
    notificationOutput << std::setfill('0') <<
        "NetId 0x" << pAddr->netId <<
        "hUser 0x" << std::hex << std::setw(4) << hUser <<
        " sample time: " << std::dec << pNotification->nTimeStamp <<
        " sample size: " << std::dec << pNotification->cbSampleSize <<
        " value: 0x" << std::hex << (int)pData[0] << '\n';
}